

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_path_unmatched_inclusions_next(archive *_a,char **_p)

{
  int iVar1;
  wchar_t magic_test;
  wchar_t r;
  void *v;
  archive_match *a;
  char **_p_local;
  archive *_a_local;
  
  a = (archive_match *)_p;
  _p_local = (char **)_a;
  iVar1 = __archive_check_magic(_a,0xcad11c9,1,"archive_match_unmatched_inclusions_next");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else {
    v = _p_local;
    _a_local._4_4_ =
         match_list_unmatched_inclusions_next
                   ((archive_match *)_p_local,(match_list *)(_p_local + 0x18),L'\x01',
                    (void **)&magic_test);
    *(void **)&a->archive = _magic_test;
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_match_path_unmatched_inclusions_next(struct archive *_a,
    const char **_p)
{
	struct archive_match *a;
	const void *v;
	int r;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_unmatched_inclusions_next");
	a = (struct archive_match *)_a;

	r = match_list_unmatched_inclusions_next(a, &(a->inclusions), 1, &v);
	*_p = (const char *)v;
	return (r);
}